

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O0

void xercesc_4_0::XMLString::trim(XMLCh *toTrim)

{
  bool bVar1;
  XMLSize_t XVar2;
  long local_30;
  XMLSize_t index;
  XMLSize_t scrape;
  XMLSize_t skip;
  XMLSize_t len;
  XMLCh *toTrim_local;
  
  XVar2 = stringLen(toTrim);
  scrape = 0;
  while ((index = XVar2, scrape < XVar2 && (bVar1 = XMLChar1_0::isWhitespace(toTrim[scrape]), bVar1)
         )) {
    scrape = scrape + 1;
  }
  while ((scrape < index && (bVar1 = XMLChar1_0::isWhitespace(toTrim[index - 1]), bVar1))) {
    index = index - 1;
  }
  if (index != XVar2) {
    toTrim[index] = L'\0';
  }
  if (scrape != 0) {
    local_30 = 0;
    while (toTrim[scrape] != L'\0') {
      toTrim[local_30] = toTrim[scrape];
      local_30 = local_30 + 1;
      scrape = scrape + 1;
    }
    toTrim[local_30] = L'\0';
  }
  return;
}

Assistant:

void XMLString::trim(XMLCh* const toTrim)
{
    const XMLSize_t len = stringLen(toTrim);

    XMLSize_t skip, scrape;
    for (skip = 0; skip < len; skip++)
    {
        if (!XMLChar1_0::isWhitespace(toTrim[skip]))
            break;
    }

    for (scrape = len; scrape > skip; scrape--)
    {
        if (!XMLChar1_0::isWhitespace(toTrim[scrape - 1]))
            break;
    }

    // Cap off at the scrap point
    if (scrape != len)
        toTrim[scrape] = 0;

    if (skip)
    {
        // Copy the chars down
        XMLSize_t index = 0;
        while (toTrim[skip])
            toTrim[index++] = toTrim[skip++];

        toTrim[index] = 0;
    }
}